

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O1

int If_LogCreateAndXor(Vec_Int_t *vAig,int iLit0,int iLit1,int nSuppAll,int fXor)

{
  int iVar1;
  
  if (fXor != 0) {
    if (-1 < iLit1) {
      iVar1 = If_LogCreateMux(vAig,iLit0,iLit1 ^ 1,iLit1,nSuppAll);
      return iVar1;
    }
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x131,"int Abc_LitNot(int)");
  }
  if ((-1 < iLit0) && (-1 < iLit1)) {
    if ((uint)(iLit1 ^ iLit0) < 2) {
      __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                    ,0x3c,"int If_LogCreateAnd(Vec_Int_t *, int, int, int)");
    }
    iVar1 = vAig->nSize;
    Vec_IntPush(vAig,iLit0);
    Vec_IntPush(vAig,iLit1);
    iVar1 = iVar1 / 2 + nSuppAll;
    if (-1 < iVar1) {
      return iVar1 * 2;
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

static inline int If_LogCreateAndXor( Vec_Int_t * vAig, int iLit0, int iLit1, int nSuppAll, int fXor )
{
    return fXor ? If_LogCreateXor(vAig, iLit0, iLit1, nSuppAll) : If_LogCreateAnd(vAig, iLit0, iLit1, nSuppAll);
}